

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::protos::gen::NotifyDataSourceStartedRequest::~NotifyDataSourceStartedRequest
          (NotifyDataSourceStartedRequest *this)

{
  ~NotifyDataSourceStartedRequest(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

NotifyDataSourceStartedRequest::~NotifyDataSourceStartedRequest() = default;